

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.c
# Opt level: O3

SNode * add_SNode(Parser *p,D_State *state,d_loc_t *loc,D_Scope *sc)

{
  char *pcVar1;
  D_Reduction *reduction;
  SNode *sn;
  Shift *pSVar2;
  D_State *pDVar3;
  Shift *pSVar4;
  Shift *pSVar5;
  Shift **ppSVar6;
  ulong uVar7;
  
  sn = find_SNode(p,(int)((ulong)((long)state - (long)p->t->state) >> 3) * -0x11111111,sc);
  if (sn == (SNode *)0x0) {
    sn = new_SNode(p,state,loc,sc);
    pDVar3 = sn->state;
    if (pDVar3->shifts != 0) {
      ppSVar6 = &p->shifts_todo;
      pSVar2 = p->free_shifts;
      if (pSVar2 == (Shift *)0x0) {
        pSVar2 = (Shift *)malloc(0x10);
      }
      else {
        p->free_shifts = pSVar2->next;
      }
      pSVar2->snode = sn;
      sn->refcount = sn->refcount + 1;
      pSVar5 = *ppSVar6;
      if (pSVar5 == (Shift *)0x0) {
        pSVar5 = (Shift *)0x0;
      }
      else {
        pcVar1 = (sn->loc).s;
        if ((pSVar5->snode->loc).s < pcVar1) {
          do {
            pSVar4 = pSVar5;
            pSVar5 = pSVar4->next;
            if (pSVar5 == (Shift *)0x0) {
              pSVar5 = (Shift *)0x0;
              break;
            }
          } while ((pSVar5->snode->loc).s < pcVar1);
          ppSVar6 = &pSVar4->next;
        }
      }
      pSVar2->next = pSVar5;
      *ppSVar6 = pSVar2;
      pDVar3 = sn->state;
    }
    if ((pDVar3->reductions).n != 0) {
      uVar7 = 0;
      do {
        reduction = (pDVar3->reductions).v[uVar7];
        if (reduction->nelements == 0) {
          add_Reduction(p,(ZNode *)0x0,sn,reduction);
          pDVar3 = sn->state;
        }
        uVar7 = uVar7 + 1;
      } while (uVar7 < (pDVar3->reductions).n);
    }
  }
  return sn;
}

Assistant:

static SNode *add_SNode(Parser *p, D_State *state, d_loc_t *loc, D_Scope *sc) {
  uint i;
  SNode *sn = find_SNode(p, state - p->t->state, sc);
  if (sn) return sn;
  sn = new_SNode(p, state, loc, sc);
  if (sn->state->shifts) add_Shift(p, sn);
  for (i = 0; i < sn->state->reductions.n; i++)
    if (!sn->state->reductions.v[i]->nelements) add_Reduction(p, 0, sn, sn->state->reductions.v[i]);
  return sn;
}